

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotetrahedra.h
# Opt level: O3

void pzgeom::TPZGeoTetrahedra::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  int j;
  long lVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  TPZFNMatrix<4,_double> phi;
  TPZFNMatrix<12,_double> dphi;
  TPZFMatrix<double> local_1e0;
  double local_150 [5];
  TPZFMatrix<double> local_128;
  double adStack_98 [13];
  
  local_1e0.fElem = local_150;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01878f70;
  local_1e0.fSize = 4;
  local_1e0.fGiven = local_1e0.fElem;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01878c80;
  local_128.fElem = adStack_98;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018874b0;
  local_128.fSize = 0xc;
  local_128.fGiven = local_128.fElem;
  TPZVec<int>::TPZVec(&local_128.fPivot.super_TPZVec<int>,0);
  local_128.fPivot.super_TPZVec<int>.fStore = local_128.fPivot.fExtAlloc;
  local_128.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_128.fPivot.super_TPZVec<int>.fNElements = 0;
  local_128.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_128.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_128.fWork.fStore = (double *)0x0;
  local_128.fWork.fNElements = 0;
  local_128.fWork.fNAlloc = 0;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018871c0;
  pztopology::TPZTetrahedron::TShape<double>(loc,&local_1e0,&local_128);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    pdVar3 = x->fStore;
    uVar5 = 0;
    do {
      pdVar3[uVar5] = 0.0;
      lVar4 = 0;
      do {
        if ((local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
           (local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_1e0.fElem[lVar4];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar5,lVar4);
        pdVar3 = x->fStore;
        pdVar3[uVar5] = dVar1 * extraout_XMM0_Qa + pdVar3[uVar5];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_128,&PTR_PTR_01887478);
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0,&PTR_PTR_01878f38);
  return;
}

Assistant:

inline void TPZGeoTetrahedra::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < NNodes; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }